

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O0

void __thiscall SuiteFieldConvertorsTests::TestbooleanConvertTo::RunImpl(TestbooleanConvertTo *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  bool value;
  bool value_00;
  TestDetails local_c0;
  string local_a0 [2];
  TestDetails local_60;
  string local_40;
  TestbooleanConvertTo *local_10;
  TestbooleanConvertTo *this_local;
  
  local_10 = this;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::BoolConvertor::convert_abi_cxx11_(&local_40,(BoolConvertor *)0x1,value);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar3,0xe3);
  UnitTest::CheckEqual<char[2],std::__cxx11::string>
            (pTVar1,(char (*) [2])0x3c8dd8,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::BoolConvertor::convert_abi_cxx11_(local_a0,(BoolConvertor *)0x0,value_00);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_c0,*ppTVar3,0xe4);
  UnitTest::CheckEqual<char[2],std::__cxx11::string>
            (pTVar1,(char (*) [2])0x3d98f9,local_a0,&local_c0);
  std::__cxx11::string::~string((string *)local_a0);
  return;
}

Assistant:

TEST(booleanConvertTo)
{
  CHECK_EQUAL( "Y", BoolConvertor::convert( true ) );
  CHECK_EQUAL( "N", BoolConvertor::convert( false ) );
}